

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O3

sequence * toml::detail::syntax::local_time(sequence *__return_storage_ptr__,spec *s)

{
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *this;
  pointer __p;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var1;
  sequence *time;
  sequence local_f0;
  sequence *local_d0;
  repeat_exact local_c8;
  sequence local_b0;
  maybe local_90;
  maybe local_80;
  repeat_at_least local_70;
  __uniq_ptr_impl<toml::detail::sequence,_std::default_delete<toml::detail::sequence>_> local_58;
  character local_50;
  character local_40;
  
  local_f0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_exact_00555ac0;
  local_f0.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  local_d0 = __return_storage_ptr__;
  local_f0.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)operator_new(0x18);
  ((local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> =
       (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)&PTR__digit_00556790;
  local_f0.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish[1].scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> =
       (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)&PTR__scanner_base_00555960;
  *(undefined2 *)
   &local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish[2].scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> = 0x3930;
  local_c8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005558a0;
  local_c8.length_ = CONCAT71(local_c8.length_._1_7_,0x3a);
  local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_exact_00555ac0;
  local_b0.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  local_b0.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)operator_new(0x18);
  ((local_b0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> =
       (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)&PTR__digit_00556790;
  local_b0.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish[1].scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> =
       (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)&PTR__scanner_base_00555960;
  *(undefined2 *)
   &local_b0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish[2].scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> = 0x3930;
  sequence::sequence<toml::detail::repeat_exact,toml::detail::character,toml::detail::repeat_exact>
            (local_d0,(repeat_exact *)&local_f0,(character *)&local_c8,(repeat_exact *)&local_b0);
  if (local_b0.others_.
      super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (**(code **)((long)((local_b0.others_.
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
                       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> + 8))();
  }
  if (local_f0.others_.
      super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (**(code **)((long)((local_f0.others_.
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
                       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> + 8))();
  }
  if (s->v1_1_0_make_seconds_optional == true) {
    local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005558a0;
    local_40.value_ = ':';
    local_c8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_exact_00555ac0;
    local_c8.length_ = 2;
    local_c8.other_.scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
         operator_new(0x18);
    *(undefined ***)
     local_c8.other_.scanner_._M_t.
     super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
     ._M_t.
     super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
     .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = &PTR__digit_00556790
    ;
    (((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_> *)
     &((scanner_base *)
      ((long)local_c8.other_.scanner_._M_t.
             super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
             .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8))->
      _vptr_scanner_base)->_M_t).
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         (scanner_base *)&PTR__scanner_base_00555960;
    *(undefined2 *)
     &(((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_> *)
       &((scanner_base *)
        ((long)local_c8.other_.scanner_._M_t.
               super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
               ._M_t.
               super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
               .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10))->
        _vptr_scanner_base)->_M_t).
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = 0x3930;
    local_50.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005558a0;
    local_50.value_ = '.';
    local_70.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00555b18;
    local_70.length_ = 1;
    local_70.other_.scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
         operator_new(0x18);
    *(undefined ***)
     local_70.other_.scanner_._M_t.
     super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
     ._M_t.
     super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
     .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = &PTR__digit_00556790
    ;
    ((scanner_base *)
    ((long)local_70.other_.scanner_._M_t.
           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
           .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8))->
    _vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555960;
    *(undefined2 *)
     &((scanner_base *)
      ((long)local_70.other_.scanner_._M_t.
             super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
             .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10))->
      _vptr_scanner_base = 0x3930;
    sequence::sequence<toml::detail::character,toml::detail::repeat_at_least>
              (&local_b0,&local_50,&local_70);
    local_80.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__maybe_00555b70;
    local_80.other_.scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
         operator_new(0x20);
    *(undefined ***)
     local_80.other_.scanner_._M_t.
     super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
     ._M_t.
     super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
     .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         &PTR__sequence_00555a10;
    *(pointer *)
     ((long)local_80.other_.scanner_._M_t.
            super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
            ._M_t.
            super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
            .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) =
         local_b0.others_.
         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)local_80.other_.scanner_._M_t.
            super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
            ._M_t.
            super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
            .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10) =
         local_b0.others_.
         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)local_80.other_.scanner_._M_t.
            super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
            ._M_t.
            super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
            .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x18) =
         local_b0.others_.
         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_t.
    super__Tuple_impl<0UL,_toml::detail::sequence_*,_std::default_delete<toml::detail::sequence>_>.
    super__Head_base<0UL,_toml::detail::sequence_*,_false>._M_head_impl =
         (tuple<toml::detail::sequence_*,_std::default_delete<toml::detail::sequence>_>)
         (_Tuple_impl<0UL,_toml::detail::sequence_*,_std::default_delete<toml::detail::sequence>_>)
         0x0;
    std::unique_ptr<toml::detail::sequence,_std::default_delete<toml::detail::sequence>_>::
    ~unique_ptr((unique_ptr<toml::detail::sequence,_std::default_delete<toml::detail::sequence>_> *)
                &local_58);
    sequence::sequence<toml::detail::character,toml::detail::repeat_exact,toml::detail::maybe>
              (&local_f0,&local_40,&local_c8,&local_80);
    local_90.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__maybe_00555b70;
    local_90.other_.scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
         operator_new(0x20);
    *(undefined ***)
     local_90.other_.scanner_._M_t.
     super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
     ._M_t.
     super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
     .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         &PTR__sequence_00555a10;
    *(pointer *)
     ((long)local_90.other_.scanner_._M_t.
            super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
            ._M_t.
            super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
            .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) =
         local_f0.others_.
         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)local_90.other_.scanner_._M_t.
            super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
            ._M_t.
            super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
            .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10) =
         local_f0.others_.
         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)local_90.other_.scanner_._M_t.
            super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
            ._M_t.
            super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
            .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x18) =
         local_f0.others_.
         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_t.
    super__Tuple_impl<0UL,_toml::detail::sequence_*,_std::default_delete<toml::detail::sequence>_>.
    super__Head_base<0UL,_toml::detail::sequence_*,_false>._M_head_impl =
         (tuple<toml::detail::sequence_*,_std::default_delete<toml::detail::sequence>_>)
         (_Tuple_impl<0UL,_toml::detail::sequence_*,_std::default_delete<toml::detail::sequence>_>)
         0x0;
    std::unique_ptr<toml::detail::sequence,_std::default_delete<toml::detail::sequence>_>::
    ~unique_ptr((unique_ptr<toml::detail::sequence,_std::default_delete<toml::detail::sequence>_> *)
                &local_58);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::maybe>(&local_d0->others_,&local_90);
    if (local_90.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
        (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_90.other_.scanner_._M_t.
                            super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                            .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl
                  + 8))();
    }
    local_90.other_.scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
         (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
          )0x0;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_f0.others_);
    if (local_80.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
        (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
         )0x0) {
      (*(*(_func_int ***)
          local_80.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
    }
    local_80.other_.scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
         (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
          )0x0;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_b0.others_);
    _Var1._M_head_impl = (scanner_base *)local_c8.other_;
    if (local_70.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
        (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
         )0x0) {
      (*(*(_func_int ***)
          local_70.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
      _Var1._M_head_impl =
           (scanner_base *)
           local_c8.other_.scanner_._M_t.
           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
           .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
    }
  }
  else {
    local_f0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005558a0;
    local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_f0.others_.
                           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x3a);
    this = &local_d0->others_;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::character>(this,(character *)&local_f0);
    local_f0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_exact_00555ac0;
    local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
    local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)operator_new(0x18);
    ((local_f0.others_.
      super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
      ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> =
         (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)&PTR__digit_00556790;
    local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish[1].scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> =
         (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)&PTR__scanner_base_00555960;
    *(undefined2 *)
     &local_f0.others_.
      super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
      ._M_impl.super__Vector_impl_data._M_finish[2].scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> = 0x3930;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::repeat_exact>(this,(repeat_exact *)&local_f0);
    if (local_f0.others_.
        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      (**(code **)((long)((local_f0.others_.
                           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
                         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> + 8))();
    }
    local_70.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005558a0;
    local_70.length_ = CONCAT71(local_70.length_._1_7_,0x2e);
    local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00555b18;
    local_b0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    local_b0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)operator_new(0x18);
    (((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_> *)
     &((scanner_base *)
      local_b0.others_.
      super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
      ._M_impl.super__Vector_impl_data._M_finish)->_vptr_scanner_base)->_M_t).
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> =
         (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)&PTR__digit_00556790;
    (((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_> *)
     &((scanner_base *)
      local_b0.others_.
      super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
      ._M_impl.super__Vector_impl_data._M_finish)[1]._vptr_scanner_base)->_M_t).
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         (scanner_base *)&PTR__scanner_base_00555960;
    *(undefined2 *)
     &(((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_> *)
       &((scanner_base *)
        local_b0.others_.
        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
        ._M_impl.super__Vector_impl_data._M_finish)[2]._vptr_scanner_base)->_M_t).
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = 0x3930;
    sequence::sequence<toml::detail::character,toml::detail::repeat_at_least>
              (&local_f0,(character *)&local_70,(repeat_at_least *)&local_b0);
    local_c8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__maybe_00555b70;
    local_c8.length_ = (size_t)operator_new(0x20);
    *(undefined ***)local_c8.length_ = &PTR__sequence_00555a10;
    *(pointer *)(local_c8.length_ + 8) =
         local_f0.others_.
         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(local_c8.length_ + 0x10) =
         local_f0.others_.
         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(local_c8.length_ + 0x18) =
         local_f0.others_.
         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.super_scanner_base._vptr_scanner_base = (_func_int **)0x0;
    std::unique_ptr<toml::detail::sequence,_std::default_delete<toml::detail::sequence>_>::
    ~unique_ptr((unique_ptr<toml::detail::sequence,_std::default_delete<toml::detail::sequence>_> *)
                &local_90);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::maybe>(this,(maybe *)&local_c8);
    if ((long *)local_c8.length_ != (long *)0x0) {
      (**(code **)(*(long *)local_c8.length_ + 8))();
    }
    local_c8.length_ = 0;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_f0.others_);
    _Var1._M_head_impl =
         (scanner_base *)
         local_b0.others_.
         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (_Var1._M_head_impl != (scanner_base *)0x0) {
    (*(code *)(((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                 *)&(_Var1._M_head_impl)->_vptr_scanner_base)->_M_t).
              super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
              ._M_t.
              super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
              .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl[1].
              _vptr_scanner_base)();
  }
  return local_d0;
}

Assistant:

TOML11_INLINE sequence local_time(const spec& s)
{
    auto time = sequence(
            repeat_exact(2, digit(s)),
            character(':'),
            repeat_exact(2, digit(s))
        );

    if(s.v1_1_0_make_seconds_optional)
    {
        time.push_back(maybe(sequence(
                character(':'),
                repeat_exact(2, digit(s)),
                maybe(sequence(character('.'), repeat_at_least(1, digit(s))))
            )));
    }
    else
    {
        time.push_back(character(':'));
        time.push_back(repeat_exact(2, digit(s)));
        time.push_back(
            maybe(sequence(character('.'), repeat_at_least(1, digit(s))))
        );
    }

    return time;
}